

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# q26numeric.h
# Opt level: O0

int q26::saturate_cast<int,long_long>(longlong x)

{
  undefined4 local_18;
  undefined4 local_14;
  int Hi;
  int Lo;
  longlong x_local;
  
  if (x < -0x80000000) {
    local_14 = -0x80000000;
  }
  else {
    if (x < 0x80000000) {
      local_18 = (int)x;
    }
    else {
      local_18 = 0x7fffffff;
    }
    local_14 = local_18;
  }
  return local_14;
}

Assistant:

constexpr auto saturate_cast(From x)
{
    static_assert(std::is_integral_v<To>);
    static_assert(std::is_integral_v<From>);

    [[maybe_unused]]
    constexpr auto Lo = (std::numeric_limits<To>::min)();
    constexpr auto Hi = (std::numeric_limits<To>::max)();

    if constexpr (std::is_signed_v<From> == std::is_signed_v<To>) {
        // same signedness, we can accept regular integer conversion rules
        return x < Lo  ? Lo :
               x > Hi  ? Hi :
               /*else*/  To(x);
    } else {
        if constexpr (std::is_signed_v<From>) { // ie. !is_signed_v<To>
            if (x < From{0})
                return To{0};
        }

        // from here on, x >= 0
        using FromU = std::make_unsigned_t<From>;
        using ToU = std::make_unsigned_t<To>;
        return FromU(x) > ToU(Hi) ? Hi : To(x); // assumes Hi >= 0
    }
}